

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O1

void test_ws_location_wrong_http_headers(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *__s_03;
  char *__s_04;
  cio_http_data_cb_t p_Var4;
  cio_http_client *pcVar5;
  cio_error cVar6;
  cio_http_cb_return cVar7;
  size_t sVar8;
  long lVar9;
  char *sub_protocols [2];
  cio_websocket_location_handler handler;
  cio_http_client client;
  char *local_958;
  char *pcStack_950;
  cio_websocket_location_handler local_948;
  cio_http_client local_400;
  
  lVar9 = 0x38;
  do {
    __s = *(char **)(lVar9 + 0x109bb8);
    __s_00 = *(char **)(lVar9 + 0x109bc0);
    __s_01 = *(char **)(lVar9 + 0x109bc8);
    __s_02 = *(char **)(lVar9 + 0x109bd0);
    __s_03 = *(char **)(lVar9 + 0x109bd8);
    __s_04 = *(char **)((long)&__frame_dummy_init_array_entry + lVar9);
    iVar1 = *(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar9);
    iVar2 = *(int *)((long)&__do_global_dtors_aux_fini_array_entry + lVar9 + 4);
    iVar3 = *(int *)((long)&PTR_sec_ws_key_field_00109bf0 + lVar9);
    local_958 = "echo";
    pcStack_950 = "jet";
    cVar6 = cio_websocket_location_handler_init
                      (&local_948,&local_958,2,on_connect,fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)cVar6,"web socket handler initialization failed!",0x164,
               UNITY_DISPLAY_STYLE_INT);
    p_Var4 = local_948.http_location.on_header_field_name;
    local_400.add_response_header = fake_add_response_header;
    local_400.write_response = fake_write_response;
    local_400.close = client_close;
    local_400.parser._23_1_ = local_400.parser._23_1_ | 0x80;
    local_400.http_method = CIO_HTTP_GET;
    local_400.http_major = 1;
    local_400.http_minor = 1;
    local_948.websocket.ws_private.http_client = &local_400;
    local_400.current_handler = &local_948.http_location;
    sVar8 = strlen(__s_01);
    cVar7 = (*p_Var4)(&local_400,__s_01,sVar8);
    UnityAssertEqualNumber
              (0,(long)cVar7,"on_header_field returned wrong value for sec_ws_version_field",0x174,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_948.websocket.ws_private.http_client;
    p_Var4 = local_948.http_location.on_header_field_value;
    sVar8 = strlen(__s_02);
    cVar7 = (*p_Var4)(pcVar5,__s_02,sVar8);
    UnityAssertEqualNumber
              ((long)iVar1,(long)cVar7,
               "on_header_value returned wrong value for sec_ws_version_value",0x176,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_948.websocket.ws_private.http_client;
    p_Var4 = local_948.http_location.on_header_field_name;
    sVar8 = strlen(__s);
    cVar7 = (*p_Var4)(pcVar5,__s,sVar8);
    UnityAssertEqualNumber
              (0,(long)cVar7,"on_header_field returned wrong value for sec_ws_key_field",0x179,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_948.websocket.ws_private.http_client;
    p_Var4 = local_948.http_location.on_header_field_value;
    sVar8 = strlen(__s_00);
    cVar7 = (*p_Var4)(pcVar5,__s_00,sVar8);
    UnityAssertEqualNumber
              ((long)iVar2,(long)cVar7,"on_header_value returned wrong value for sec_ws_key_value",
               0x17b,UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_948.websocket.ws_private.http_client;
    p_Var4 = local_948.http_location.on_header_field_name;
    sVar8 = strlen(__s_03);
    cVar7 = (*p_Var4)(pcVar5,__s_03,sVar8);
    UnityAssertEqualNumber
              (0,(long)cVar7,"on_header_field returned wrong value for protocol_field",0x17e,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_948.websocket.ws_private.http_client;
    p_Var4 = local_948.http_location.on_header_field_value;
    sVar8 = strlen(__s_04);
    cVar7 = (*p_Var4)(pcVar5,__s_04,sVar8);
    UnityAssertEqualNumber
              (0,(long)cVar7,"on_header_value returned wrong value for protocol_value",0x180,
               UNITY_DISPLAY_STYLE_INT);
    cVar7 = (*local_948.http_location.on_headers_complete)
                      (local_948.websocket.ws_private.http_client);
    UnityAssertEqualNumber
              ((long)iVar3,(long)cVar7,"on_header_complete returned wrong value",0x183,
               UNITY_DISPLAY_STYLE_INT);
    if ((long)iVar3 == 1) {
      UnityAssertEqualNumber
                (1,(ulong)fake_write_response_fake.call_count,"write_response was not called",0x185,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)on_connect_fake.call_count,"websocket on_connect was not called",0x186,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0x65,(ulong)fake_write_response_fake.arg1_val,
                 "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS",0x187,
                 UNITY_DISPLAY_STYLE_INT);
      (*local_948.websocket.ws_private.close_hook)(&local_948.websocket);
    }
    memset(&fff,0,0x194);
    memset(&cio_http_location_handler_init_fake,0,0x1c0);
    cio_http_location_handler_init_fake.arg_history_len = 0x32;
    memset(&cio_websocket_server_init_fake,0,0x5c8);
    cio_websocket_server_init_fake.arg_history_len = 0x32;
    memset(&fake_handler_free_fake,0,0x1c0);
    fake_handler_free_fake.arg_history_len = 0x32;
    memset(&fake_add_response_header_fake,0,0x358);
    fake_add_response_header_fake.arg_history_len = 0x32;
    memset(&fake_write_response_fake,0,0x698);
    fake_write_response_fake.arg_history_len = 0x32;
    memset(&on_connect_fake,0,0x1c0);
    on_connect_fake.arg_history_len = 0x32;
    memset(&on_error_fake,0,0x358);
    on_error_fake.arg_history_len = 0x32;
    memset(&client_close_fake,0,0x1c0);
    client_close_fake.arg_history_len = 0x32;
    cio_websocket_server_init_fake.custom_fake = websocket_init_save_params;
    fake_write_response_fake.custom_fake = write_response_call_callback;
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0x1f8);
  return;
}

Assistant:

static void test_ws_location_wrong_http_headers(void)
{
	struct upgrade_test {
		const char *sec_key_field;
		const char *sec_key_value;
		const char *version_field;
		const char *version_value;
		const char *protocol_field;
		const char *protocol_value;
		enum cio_http_cb_return on_header_value_retval_version;
		enum cio_http_cb_return on_header_value_retval_key;
		enum cio_http_cb_return on_headers_retval;
	};

	struct upgrade_test tests[] = {
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_SKIP_BODY},
	    {.sec_key_field = "Sic-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Wersion",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "lIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_ERROR,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "12",
	     .on_header_value_retval_version = CIO_HTTP_CB_ERROR,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "2",
	     .on_header_value_retval_version = CIO_HTTP_CB_ERROR,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Portocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_SKIP_BODY}};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct upgrade_test test = tests[i];

		const char *sub_protocols[] = {"echo", "jet"};
		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, sub_protocols, ARRAY_SIZE(sub_protocols), on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_client client;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;
		handler.websocket.ws_private.http_client->close = client_close;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = 1;
		handler.websocket.ws_private.http_client->http_minor = 1;

		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.version_field, strlen(test.version_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.version_value, strlen(test.version_value));
		TEST_ASSERT_EQUAL_MESSAGE(test.on_header_value_retval_version, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.sec_key_field, strlen(test.sec_key_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.sec_key_value, strlen(test.sec_key_value));
		TEST_ASSERT_EQUAL_MESSAGE(test.on_header_value_retval_key, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.protocol_field, strlen(test.protocol_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for protocol_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.protocol_value, strlen(test.protocol_value));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for protocol_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(test.on_headers_retval, cb_ret, "on_header_complete returned wrong value");
		if (test.on_headers_retval == CIO_HTTP_CB_SKIP_BODY) {
			TEST_ASSERT_EQUAL_MESSAGE(1, fake_write_response_fake.call_count, "write_response was not called");
			TEST_ASSERT_EQUAL_MESSAGE(1, on_connect_fake.call_count, "websocket on_connect was not called");
			TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, fake_write_response_fake.arg1_val, "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS");

			handler.websocket.ws_private.close_hook(&handler.websocket);
		}

		setUp();
	}
}